

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O3

void Gia_ManFanoutStart(Gia_Man_t *p)

{
  Gia_Obj_t *pFanout;
  int iVar1;
  int *__s;
  ulong uVar2;
  Gia_Obj_t *pObj;
  long lVar3;
  long lVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  
  if (p->pFanData != (int *)0x0) {
    __assert_fail("p->pFanData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0x47,"void Gia_ManFanoutStart(Gia_Man_t *)");
  }
  iVar1 = p->nObjs;
  iVar6 = 0x1000;
  if (0x7ff < iVar1) {
    iVar6 = iVar1 * 2;
  }
  p->nFansAlloc = iVar6;
  __s = (int *)malloc((long)(iVar6 * 5) << 2);
  p->pFanData = __s;
  memset(__s,0,(long)iVar6 * 0x14);
  if (0 < iVar1) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return;
      }
      pFanout = (Gia_Obj_t *)(&pGVar5->field_0x0 + lVar3);
      uVar2 = *(ulong *)(&pGVar5->field_0x0 + lVar3);
      pObj = (Gia_Obj_t *)(lVar3 + (ulong)(((uint)uVar2 & 0x1fffffff) << 2) * -3 + (long)pGVar5);
      if (pObj != (Gia_Obj_t *)(ulong)(((uint)uVar2 >> 0x1d & 1) != 0)) {
        Gia_ObjAddFanout(p,pObj,pFanout);
        uVar2 = *(ulong *)pFanout;
      }
      pGVar5 = (Gia_Obj_t *)
               ((long)pGVar5 + lVar3 + (ulong)((uint)(uVar2 >> 0x1e) & 0x7ffffffc) * -3);
      if (pGVar5 != (Gia_Obj_t *)(ulong)((uVar2 >> 0x3d & 1) != 0)) {
        Gia_ObjAddFanout(p,pGVar5,pFanout);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar4 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManFanoutStart( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Gia_ManObjNum(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjChild0(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
        if ( Gia_ObjChild1(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin1(pObj), pObj );
    }
}